

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::objectWarning(QPDFObjectHandle *this,string *warning)

{
  undefined8 qpdf;
  element_type *this_00;
  allocator<char> local_f1;
  string local_f0;
  QPDFExc local_d0;
  undefined1 local_40 [8];
  string description;
  QPDF *context;
  string *warning_local;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_40);
  this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       this);
  QPDFObject::getDescription(this_00,(QPDF **)((long)&description.field_2 + 8),(string *)local_40);
  qpdf = description.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
  QPDFExc::QPDFExc(&local_d0,qpdf_e_object,&local_f0,(string *)local_40,0,warning);
  warn((QPDF *)qpdf,&local_d0);
  QPDFExc::~QPDFExc(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void
QPDFObjectHandle::objectWarning(std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    // Type checks above guarantee that the object is initialized.
    obj->getDescription(context, description);
    // Null context handled by warn
    warn(context, QPDFExc(qpdf_e_object, "", description, 0, warning));
}